

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Get
          (PersistentStorageJson *this,RegistrarId *aId,BorderRouter *aRetValue)

{
  uint32_t *puVar1;
  byte *pbVar2;
  Status SVar3;
  int iVar4;
  Domain dom;
  Network nwk;
  Domain DStack_d8;
  string local_b0;
  Network local_90;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,JSON_BR_abi_cxx11_,DAT_002e28c8 + JSON_BR_abi_cxx11_);
  SVar3 = GetId<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>
                    (this,aId,aRetValue,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (SVar3 == kSuccess) {
    if ((aRetValue->mNetworkId).mId == 0xffffffff) {
      SVar3 = kSuccess;
    }
    else {
      Network::Network(&local_90);
      iVar4 = (*(this->super_PersistentStorage)._vptr_PersistentStorage[0xe])
                        (this,&aRetValue->mNetworkId,&local_90);
      SVar3 = (Status)iVar4;
      if (SVar3 == kSuccess) {
        if (local_90.mName._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(aRetValue->mAgent).mNetworkName);
          puVar1 = &(aRetValue->mAgent).mPresentFlags;
          *(byte *)puVar1 = (byte)*puVar1 | 0x10;
        }
        if (local_90.mXpan != 0) {
          (aRetValue->mAgent).mExtendedPanId = local_90.mXpan;
          puVar1 = &(aRetValue->mAgent).mPresentFlags;
          *(byte *)puVar1 = (byte)*puVar1 | 0x20;
        }
        if (local_90.mDomainId.mId == 0xffffffff) {
          SVar3 = kSuccess;
        }
        else {
          Domain::Domain(&DStack_d8);
          iVar4 = (*(this->super_PersistentStorage)._vptr_PersistentStorage[0xd])
                            (this,&local_90.mDomainId,&DStack_d8);
          SVar3 = (Status)iVar4;
          if ((SVar3 == kSuccess) && (DStack_d8.mName._M_string_length != 0)) {
            std::__cxx11::string::_M_assign((string *)&(aRetValue->mAgent).mDomainName);
            pbVar2 = (byte *)((long)&(aRetValue->mAgent).mPresentFlags + 1);
            *pbVar2 = *pbVar2 | 0x10;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)DStack_d8.mName._M_dataplus._M_p != &DStack_d8.mName.field_2) {
            operator_delete(DStack_d8.mName._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
        operator_delete(local_90.mMlp._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
        operator_delete(local_90.mName._M_dataplus._M_p);
      }
    }
  }
  return SVar3;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Get(BorderRouterId const &aId, BorderRouter &aRetValue)
{
    Status status = GetId<BorderRouter, BorderRouterId>(aId, aRetValue, JSON_BR);

    if (status == Status::kSuccess && aRetValue.mNetworkId.mId != EMPTY_ID)
    {
        Network nwk;
        status = Get(aRetValue.mNetworkId, nwk);
        if (status == Status::kSuccess)
        {
            if (!nwk.mName.empty())
            {
                aRetValue.mAgent.mNetworkName = nwk.mName;
                aRetValue.mAgent.mPresentFlags |= BorderAgent::kNetworkNameBit;
            }
            if (nwk.mXpan != 0)
            {
                aRetValue.mAgent.mExtendedPanId = nwk.mXpan;
                aRetValue.mAgent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
            }
            if (nwk.mDomainId.mId != EMPTY_ID)
            {
                Domain dom;
                status = Get(nwk.mDomainId, dom);
                if (status == Status::kSuccess && !dom.mName.empty())
                {
                    aRetValue.mAgent.mDomainName = dom.mName;
                    aRetValue.mAgent.mPresentFlags |= BorderAgent::kDomainNameBit;
                }
            }
        }
    }

    return status;
}